

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O1

TestStatus * __thiscall
vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::iterate
          (TestStatus *__return_storage_ptr__,
          FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters> *this)

{
  Context *pCVar1;
  Function p_Var2;
  pointer pcVar3;
  Parameters PVar4;
  long *local_40 [2];
  long local_30 [2];
  
  pCVar1 = (this->super_TestInstance).m_context;
  p_Var2 = (this->m_args).func;
  PVar4 = SUB41((this->m_args).arg0.shaderStage,0);
  pcVar3 = (this->m_args).arg0.binaryName._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar3,pcVar3 + (this->m_args).arg0.binaryName._M_string_length);
  (*p_Var2)(__return_storage_ptr__,pCVar1,PVar4);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate				(void) { return m_args.func(m_context, m_args.arg0); }